

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O0

void Assimp::IFC::ProcessSweptDiskSolid
               (IfcSweptDiskSolid *solid,TempMesh *result,ConversionData *conv)

{
  uint uVar1;
  aiVector3t<float> aVar2;
  aiVector3t<float> aVar3;
  aiVector3t<float> aVar4;
  aiVector3t<float> aVar5;
  aiVector3t<float> aVar6;
  bool bVar7;
  IfcCurve *curve_00;
  Curve *pCVar8;
  const_reference pvVar9;
  reference pvVar10;
  aiVector3t<double> *paVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar12;
  double dVar13;
  aiVector3t<float> aVar14;
  value_type_conflict1 local_374;
  aiVector3t<double> local_370;
  aiVector3t<double> local_358;
  aiVector3t<double> local_340;
  aiVector3t<double> local_328;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_310;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_308;
  aiVector3t<double> *local_300;
  IfcVector3 *v4;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_2f0;
  reference local_2e8;
  IfcVector3 *v3;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_2d8;
  reference local_2d0;
  IfcVector3 *v2;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_2c0;
  reference local_2b8;
  IfcVector3 *v1;
  float fStack_2a8;
  uint seg_2;
  float local_2a0;
  aiVector3t<float> local_298;
  float local_28c;
  float fStack_288;
  float l;
  float local_280;
  aiVector3t<float> local_278;
  aiVector3t<float> *local_268;
  aiVector3D *p;
  float local_258;
  uint seg_1;
  float best_distance_squared;
  uint best_pair_offset;
  float local_248;
  aiVector3t<float> local_23c;
  aiVector3t<float> *local_230;
  aiVector3D *this_start;
  size_t i_2;
  uint local_204;
  undefined1 local_200 [4];
  uint seg;
  IfcMatrix4 rot;
  uint i_1;
  bool take_any;
  IfcVector3 q;
  aiVector3t<double> local_148;
  undefined1 local_130 [8];
  IfcVector3 d;
  size_t i;
  undefined1 auStack_108 [4];
  uint last_dir;
  IfcVector3 startvec;
  IfcVector3 next;
  IfcVector3 previous;
  IfcVector3 current;
  undefined1 local_a0 [8];
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> points;
  size_t samples;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *curve_points;
  undefined1 local_68 [8];
  TempMesh temp;
  IfcFloat deltaAngle;
  uint cnt_segments;
  Curve *curve;
  ConversionData *conv_local;
  TempMesh *result_local;
  IfcSweptDiskSolid *solid_local;
  
  curve_00 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::operator*
                       ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)
                        &(solid->super_IfcSolidModel).field_0x40);
  pCVar8 = Curve::Convert(curve_00,conv);
  if (pCVar8 == (Curve *)0x0) {
    LogFunctions<Assimp::IFCImporter>::LogError
              ("failed to convert Directrix curve (IfcSweptDiskSolid)");
  }
  else {
    uVar1 = conv->settings->cylindricalTessellation;
    temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(6.283185307179586 / (double)uVar1);
    TempMesh::TempMesh((TempMesh *)local_68);
    (*pCVar8->_vptr_Curve[7])(solid->StartParam,solid->EndParam,pCVar8,(TempMesh *)local_68);
    points.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             local_68);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&result->mVerts,
               (ulong)uVar1 *
               (long)points.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage * 4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&result->mVertcnt,
               (ulong)(uVar1 - 1) *
               (long)points.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_a0);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_a0,
               (ulong)uVar1 *
               (long)points.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::empty
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_68)
    ;
    if (bVar7) {
      LogFunctions<Assimp::IFCImporter>::LogWarn
                ("curve evaluation yielded no points (IfcSweptDiskSolid)");
    }
    else {
      pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                         ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                          local_68,0);
      next.z = pvVar9->x;
      current.x = pvVar9->y;
      current.y = pvVar9->z;
      previous.x = current.x;
      previous.y = current.y;
      previous.z = next.z;
      aiVector3t<double>::aiVector3t((aiVector3t<double> *)&startvec.z);
      aiVector3t<double>::aiVector3t((aiVector3t<double> *)auStack_108);
      _auStack_108 = 1.0;
      startvec.x = 1.0;
      startvec.y = 1.0;
      i._4_4_ = 0;
      for (d.z = 0.0; aVar6.z = local_23c.z, aVar6.x = local_23c.x, aVar6.y = local_23c.y,
          aVar5.z = local_278.z, aVar5.x = local_278.x, aVar5.y = local_278.y, aVar4.z = local_298.z
          , aVar4.x = local_298.x, aVar4.y = local_298.y, aVar3.z = local_248,
          aVar3.x = best_distance_squared, aVar3.y = (float)best_pair_offset, aVar2.z = local_280,
          aVar2.x = fStack_288, aVar2.y = l, aVar14.z = local_2a0, aVar14.x = fStack_2a8,
          aVar14.y = (float)seg_2,
          (ulong)d.z <
          points.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage; d.z = (double)((long)d.z + 1)) {
        if ((undefined1 *)d.z !=
            (undefined1 *)
            ((long)&points.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage[-1].z + 7)) {
          pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                             ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                              local_68,(long)d.z + 1);
          startvec.z = pvVar9->x;
          next.x = pvVar9->y;
          next.y = pvVar9->z;
        }
        ::operator-(&local_148,(aiVector3t<double> *)&previous.z,(aiVector3t<double> *)&next.z);
        ::operator-((aiVector3t<double> *)&q.z,(aiVector3t<double> *)&startvec.z,
                    (aiVector3t<double> *)&next.z);
        ::operator+((aiVector3t<double> *)local_130,&local_148,(aiVector3t<double> *)&q.z);
        aiVector3t<double>::Normalize((aiVector3t<double> *)local_130);
        paVar11 = (aiVector3t<double> *)&i_1;
        aiVector3t<double>::aiVector3t(paVar11);
        rot.d4._7_1_ = 0;
        for (rot.d4._0_4_ = 0; rot.d4._0_4_ < 2; rot.d4._0_4_ = rot.d4._0_4_ + 1) {
          if ((i._4_4_ == 0) || (rot.d4._7_1_ != 0)) {
            std::abs((int)paVar11);
            if (1e-06 < extraout_XMM0_Qa) {
              q.x = startvec.x;
              q.y = startvec.y;
              _i_1 = -(d.x * startvec.x + d.y * startvec.y) / (double)local_130;
              i._4_4_ = 0;
              break;
            }
          }
          if ((i._4_4_ == 1) || ((rot.d4._7_1_ & 1) != 0)) {
            std::abs((int)paVar11);
            if (1e-06 < extraout_XMM0_Qa_00) {
              _i_1 = _auStack_108;
              q.y = startvec.y;
              q.x = -((double)local_130 * _auStack_108 + d.y * startvec.y) / d.x;
              i._4_4_ = 1;
              break;
            }
          }
          if (i._4_4_ == 2) {
            std::abs((int)paVar11);
            if (extraout_XMM0_Qa_01 <= 1e-06) goto LAB_009592d2;
LAB_009592db:
            q.x = startvec.x;
            _i_1 = _auStack_108;
            q.y = -(d.x * startvec.x + (double)local_130 * _auStack_108) / d.y;
            i._4_4_ = 2;
            break;
          }
LAB_009592d2:
          if ((rot.d4._7_1_ & 1) != 0) goto LAB_009592db;
          rot.d4._7_1_ = 1;
        }
        dVar13 = solid->Radius;
        dVar12 = aiVector3t<double>::Length((aiVector3t<double> *)&i_1);
        aiVector3t<double>::operator*=((aiVector3t<double> *)&i_1,dVar13 / dVar12);
        startvec.y = q.y;
        _auStack_108 = _i_1;
        startvec.x = q.x;
        aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_200);
        aiMatrix4x4t<double>::Rotation
                  ((double)temp.mVertcnt.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(aiVector3t<double> *)local_130
                   ,(aiMatrix4x4t<double> *)local_200);
        local_204 = 0;
        while (local_204 < uVar1) {
          ::operator+((aiVector3t<double> *)&i_2,(aiVector3t<double> *)&i_1,
                      (aiVector3t<double> *)&previous.z);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_a0,
                     (value_type *)&i_2);
          local_204 = local_204 + 1;
          aiVector3t<double>::operator*=
                    ((aiVector3t<double> *)&i_1,(aiMatrix4x4t<double> *)local_200);
        }
        next.z = previous.z;
        previous.x = current.x;
        previous.y = current.y;
        previous.z = startvec.z;
        current.x = next.x;
        current.y = next.y;
      }
      _fStack_2a8 = aVar14;
      _fStack_288 = aVar2;
      _best_distance_squared = aVar3;
      local_298 = aVar4;
      local_278 = aVar5;
      local_23c = aVar6;
      for (this_start = (aiVector3D *)0x0;
          this_start <
          (aiVector3D *)
          ((long)&points.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage[-1].z + 7U);
          this_start = (aiVector3D *)((long)&this_start->x + 1)) {
        pvVar10 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             local_a0,(long)this_start * (ulong)uVar1);
        aVar14 = aiVector3t::operator_cast_to_aiVector3t((aiVector3t *)pvVar10);
        local_230 = &local_23c;
        seg_1 = 0;
        local_258 = 1e+10;
        _best_distance_squared = aVar14;
        local_23c = aVar14;
        for (p._4_4_ = 0; p._4_4_ < uVar1; p._4_4_ = p._4_4_ + 1) {
          pvVar10 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                    operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               local_a0,(long)((long)&this_start->x + 1) * (ulong)uVar1 +
                                        (ulong)p._4_4_);
          aVar14 = aiVector3t::operator_cast_to_aiVector3t((aiVector3t *)pvVar10);
          local_268 = &local_278;
          _fStack_288 = aVar14;
          local_278 = aVar14;
          aVar14 = ::operator-(local_268,local_230);
          _fStack_2a8 = aVar14;
          local_298 = aVar14;
          local_28c = aiVector3t<float>::SquareLength(&local_298);
          if (local_28c < local_258) {
            seg_1 = p._4_4_;
            local_258 = local_28c;
          }
        }
        for (v1._4_4_ = 0; v1._4_4_ < uVar1; v1._4_4_ = v1._4_4_ + 1) {
          pvVar10 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                    operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               local_a0,(long)this_start * (ulong)uVar1 +
                                        (ulong)v1._4_4_ % (ulong)uVar1);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    (&result->mVerts,pvVar10);
          pvVar10 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                    operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               local_a0,(long)this_start * (ulong)uVar1 +
                                        (ulong)(v1._4_4_ + 1) % (ulong)uVar1);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    (&result->mVerts,pvVar10);
          pvVar10 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                    operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               local_a0,(long)((long)&this_start->x + 1) * (ulong)uVar1 +
                                        (ulong)(v1._4_4_ + 1 + seg_1) % (ulong)uVar1);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    (&result->mVerts,pvVar10);
          pvVar10 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                    operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               local_a0,(long)((long)&this_start->x + 1) * (ulong)uVar1 +
                                        (ulong)(v1._4_4_ + seg_1) % (ulong)uVar1);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    (&result->mVerts,pvVar10);
          v2 = (IfcVector3 *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                         (&result->mVerts);
          local_2c0 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator-((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                   *)&v2,1);
          local_2b8 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator*(&local_2c0);
          v3 = (IfcVector3 *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                         (&result->mVerts);
          local_2d8 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator-((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                   *)&v3,2);
          local_2d0 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator*(&local_2d8);
          v4 = (IfcVector3 *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                         (&result->mVerts);
          local_2f0 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator-((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                   *)&v4,3);
          local_2e8 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator*(&local_2f0);
          local_310._M_current =
               (aiVector3t<double> *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                         (&result->mVerts);
          local_308 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator-(&local_310,4);
          local_300 = __gnu_cxx::
                      __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      ::operator*(&local_308);
          ::operator-(&local_340,local_300,local_2e8);
          ::operator-(&local_358,local_300,local_2b8);
          operator^(&local_328,&local_340,&local_358);
          paVar11 = local_300;
          pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                             ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                              local_68,(size_type)this_start);
          ::operator-(&local_370,paVar11,pvVar9);
          dVar13 = ::operator*(&local_328,&local_370);
          if (dVar13 < 0.0) {
            std::swap<aiVector3t<double>>(local_300,local_2b8);
            std::swap<aiVector3t<double>>(local_2e8,local_2d0);
          }
          local_374 = 4;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&result->mVertcnt,&local_374);
        }
      }
      LogFunctions<Assimp::IFCImporter>::LogDebug
                ("generate mesh procedurally by sweeping a disk along a curve (IfcSweptDiskSolid)");
    }
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_a0);
    TempMesh::~TempMesh((TempMesh *)local_68);
  }
  return;
}

Assistant:

void ProcessSweptDiskSolid(const Schema_2x3::IfcSweptDiskSolid &solid, TempMesh& result, ConversionData& conv)
{
    const Curve* const curve = Curve::Convert(*solid.Directrix, conv);
    if(!curve) {
        IFCImporter::LogError("failed to convert Directrix curve (IfcSweptDiskSolid)");
        return;
    }

    const unsigned int cnt_segments = conv.settings.cylindricalTessellation;
    const IfcFloat deltaAngle = AI_MATH_TWO_PI/cnt_segments;

	TempMesh temp;
	curve->SampleDiscrete(temp, solid.StartParam, solid.EndParam);
	const std::vector<IfcVector3>& curve_points = temp.mVerts;

    const size_t samples = curve_points.size();

    result.mVerts.reserve(cnt_segments * samples * 4);
    result.mVertcnt.reserve((cnt_segments - 1) * samples);

    std::vector<IfcVector3> points;
    points.reserve(cnt_segments * samples);

    if(curve_points.empty()) {
        IFCImporter::LogWarn("curve evaluation yielded no points (IfcSweptDiskSolid)");
        return;
    }

    IfcVector3 current = curve_points[0];
    IfcVector3 previous = current;
    IfcVector3 next;

    IfcVector3 startvec;
    startvec.x = 1.0f;
    startvec.y = 1.0f;
    startvec.z = 1.0f;

    unsigned int last_dir = 0;

    // generate circles at the sweep positions
    for(size_t i = 0; i < samples; ++i) {

        if(i != samples - 1) {
            next = curve_points[i + 1];
        }

        // get a direction vector reflecting the approximate curvature (i.e. tangent)
        IfcVector3 d = (current-previous) + (next-previous);

        d.Normalize();

        // figure out an arbitrary point q so that (p-q) * d = 0,
        // try to maximize ||(p-q)|| * ||(p_last-q_last)||
        IfcVector3 q;
        bool take_any = false;

        for (unsigned int i = 0; i < 2; ++i, take_any = true) {
            if ((last_dir == 0 || take_any) && std::abs(d.x) > 1e-6) {
                q.y = startvec.y;
                q.z = startvec.z;
                q.x = -(d.y * q.y + d.z * q.z) / d.x;
                last_dir = 0;
                break;
            }
            else if ((last_dir == 1 || take_any) && std::abs(d.y) > 1e-6) {
                q.x = startvec.x;
                q.z = startvec.z;
                q.y = -(d.x * q.x + d.z * q.z) / d.y;
                last_dir = 1;
                break;
            }
            else if ((last_dir == 2 && std::abs(d.z) > 1e-6) || take_any) {
                q.y = startvec.y;
                q.x = startvec.x;
                q.z = -(d.y * q.y + d.x * q.x) / d.z;
                last_dir = 2;
                break;
            }
        }

        q *= solid.Radius / q.Length();
        startvec = q;

        // generate a rotation matrix to rotate q around d
        IfcMatrix4 rot;
        IfcMatrix4::Rotation(deltaAngle,d,rot);

        for (unsigned int seg = 0; seg < cnt_segments; ++seg, q *= rot ) {
            points.push_back(q + current);
        }

        previous = current;
        current = next;
    }

    // make quads
    for(size_t i = 0; i < samples - 1; ++i) {

        const aiVector3D& this_start = points[ i * cnt_segments ];

        // locate corresponding point on next sample ring
        unsigned int best_pair_offset = 0;
        float best_distance_squared = 1e10f;
        for (unsigned int seg = 0; seg < cnt_segments; ++seg) {
            const aiVector3D& p = points[ (i+1) * cnt_segments + seg];
            const float l = (p-this_start).SquareLength();

            if(l < best_distance_squared) {
                best_pair_offset = seg;
                best_distance_squared = l;
            }
        }

        for (unsigned int seg = 0; seg < cnt_segments; ++seg) {

            result.mVerts.push_back(points[ i * cnt_segments + (seg % cnt_segments)]);
            result.mVerts.push_back(points[ i * cnt_segments + (seg + 1) % cnt_segments]);
            result.mVerts.push_back(points[ (i+1) * cnt_segments + ((seg + 1 + best_pair_offset) % cnt_segments)]);
            result.mVerts.push_back(points[ (i+1) * cnt_segments + ((seg + best_pair_offset) % cnt_segments)]);

            IfcVector3& v1 = *(result.mVerts.end()-1);
            IfcVector3& v2 = *(result.mVerts.end()-2);
            IfcVector3& v3 = *(result.mVerts.end()-3);
            IfcVector3& v4 = *(result.mVerts.end()-4);

            if (((v4-v3) ^ (v4-v1)) * (v4 - curve_points[i]) < 0.0f) {
                std::swap(v4, v1);
                std::swap(v3, v2);
            }

            result.mVertcnt.push_back(4);
        }
    }

    IFCImporter::LogDebug("generate mesh procedurally by sweeping a disk along a curve (IfcSweptDiskSolid)");
}